

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O2

void __thiscall SGP4::Initialise(SGP4 *this)

{
  double *sinio;
  SatelliteException *this_00;
  ulong uVar1;
  double dVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  DateTime local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  undefined8 uStack_70;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  undefined1 local_38 [16];
  double local_28;
  double local_20;
  
  this->use_simple_model_ = false;
  this->use_deep_space_ = false;
  memset(this,0,0x268);
  dVar2 = (this->elements_).eccentricity_;
  if ((dVar2 < 0.0) || (0.999 < dVar2)) {
    this_00 = (SatelliteException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException(this_00,"Eccentricity out of range");
  }
  else {
    dVar2 = (this->elements_).inclination_;
    if ((0.0 <= dVar2) && (dVar2 <= 3.141592653589793)) {
      sinio = &(this->common_consts_).sinio;
      RecomputeConstants(dVar2,sinio,(double *)this,&(this->common_consts_).x3thm1,
                         &(this->common_consts_).x1mth2,&(this->common_consts_).x7thm1,
                         &(this->common_consts_).xlcof,&(this->common_consts_).aycof);
      local_48 = (this->common_consts_).cosio;
      local_88 = (this->elements_).eccentricity_;
      local_88 = local_88 * local_88;
      local_20 = 1.0 - local_88;
      if (local_20 < 0.0) {
        local_60 = sqrt(local_20);
      }
      else {
        local_60 = SQRT(local_20);
      }
      if (225.0 <= (this->elements_).period_) {
        this->use_deep_space_ = true;
        dVar2 = (this->elements_).perigee_;
        uVar3 = SUB84(dVar2,0);
        uVar4 = (undefined4)((ulong)dVar2 >> 0x20);
      }
      else {
        this->use_simple_model_ = false;
        this->use_deep_space_ = false;
        dVar2 = (this->elements_).perigee_;
        uVar3 = SUB84(dVar2,0);
        uVar4 = (undefined4)((ulong)dVar2 >> 0x20);
        if (dVar2 < 220.0) {
          this->use_simple_model_ = true;
        }
      }
      local_48 = local_48 * local_48;
      if (156.0 < (double)CONCAT44(uVar4,uVar3) || (double)CONCAT44(uVar4,uVar3) == 156.0) {
        local_28 = kQOMS2T;
        dVar2 = 1.0122292801892716;
        uVar3 = 0;
        uVar4 = 0;
      }
      else {
        uVar1 = -(ulong)((double)CONCAT44(uVar4,uVar3) < 98.0);
        local_38._4_4_ = (undefined4)(uVar1 >> 0x20);
        uVar5 = local_38._4_4_ & 0x40340000;
        local_38._8_8_ = 0;
        local_38._0_8_ = ~uVar1 & (ulong)((double)CONCAT44(uVar4,uVar3) + -78.0);
        local_38 = local_38 | ZEXT416(uVar5) << 0x20;
        local_28 = pow((120.0 - (double)local_38._0_8_) / 6378.135,4.0);
        uVar3 = local_38._8_4_;
        uVar4 = local_38._12_4_;
        dVar2 = local_38._0_8_ / 6378.135 + 1.0;
      }
      local_50 = (this->elements_).eccentricity_;
      dVar9 = (this->elements_).recovered_semi_major_axis_;
      local_b0 = 1.0 / (dVar9 * dVar9 * local_20 * local_20);
      local_38._8_4_ = uVar3;
      local_38._0_8_ = dVar2;
      local_38._12_4_ = uVar4;
      local_40 = 1.0 / (dVar9 - dVar2);
      local_58 = dVar9 * local_50 * local_40;
      (this->common_consts_).eta = local_58;
      local_50 = local_50 * local_58;
      local_58 = local_58 * local_58;
      local_78 = ABS(1.0 - local_58);
      uStack_70 = 0;
      dVar2 = pow(local_40,4.0);
      local_28 = dVar2 * local_28;
      local_80 = pow(local_78,3.5);
      local_80 = local_28 / local_80;
      dVar2 = (this->elements_).recovered_mean_motion_;
      dVar9 = (this->elements_).recovered_semi_major_axis_;
      dVar8 = (this->common_consts_).x3thm1;
      (this->common_consts_).c1 =
           (((local_58 + 4.0) * local_50 + local_58 * 1.5 + 1.0) * dVar9 +
           ((local_58 + 8.0) * local_58 * 3.0 + 8.0) *
           ((local_40 * 0.00040598100000000003) / local_78) * dVar8) * local_80 * dVar2 *
           (this->elements_).bstar_;
      local_a8 = (local_58 * 0.5 + 2.0) * (this->common_consts_).eta +
                 (local_58 + local_58 + 0.5) * (this->elements_).eccentricity_;
      local_78 = local_78 * dVar9;
      local_98 = ((local_50 * -0.5 + 1.5) * local_58 + (1.0 - (local_50 + local_50))) * dVar8 * -3.0
      ;
      local_a0 = (dVar2 + dVar2) * local_80 * dVar9 * local_20;
      local_90 = ((local_58 + local_58) - (local_58 + 1.0) * local_50) *
                 (this->common_consts_).x1mth2 * 0.75;
      dVar2 = (this->elements_).argument_perigee_;
      dVar2 = cos(dVar2 + dVar2);
      (this->common_consts_).c4 =
           (((local_40 * -0.001082616) / local_78) * (dVar2 * local_90 + local_98) + local_a8) *
           local_a0;
      dVar9 = local_48 * local_48;
      dVar2 = (this->elements_).recovered_mean_motion_;
      dVar8 = local_b0 * 0.0016239240000000001 * dVar2;
      dVar7 = dVar8 * 0.000541308 * local_b0;
      dVar10 = dVar7 * 0.0625;
      (this->common_consts_).xmdot =
           (dVar9 * 137.0 + local_48 * -78.0 + 13.0) * local_60 * dVar10 +
           dVar8 * 0.5 * local_60 * (this->common_consts_).x3thm1 + dVar2;
      dVar6 = local_b0 * 7.762359374999998e-07 * local_b0 * dVar2;
      (this->common_consts_).omgdot =
           (dVar9 * 49.0 + local_48 * -36.0 + 3.0) * dVar6 +
           (dVar9 * 395.0 + local_48 * -114.0 + 7.0) * dVar10 +
           dVar8 * -0.5 * (local_48 * -5.0 + 1.0);
      dVar9 = (this->common_consts_).cosio;
      dVar10 = -dVar8 * dVar9;
      dVar8 = (this->common_consts_).c1;
      (this->common_consts_).xnodot =
           ((local_48 * -7.0 + 3.0) * (dVar6 + dVar6) + (local_48 * -19.0 + 4.0) * dVar7 * 0.5) *
           dVar9 + dVar10;
      (this->common_consts_).xnodcf = local_20 * 3.5 * dVar10 * dVar8;
      (this->common_consts_).t2cof = dVar8 * 1.5;
      if (this->use_deep_space_ == true) {
        local_b8.m_encoded = (this->elements_).epoch_.m_encoded;
        dVar2 = DateTime::ToGreenwichSiderealTime(&local_b8);
        (this->deepspace_consts_).gsto = dVar2;
        DeepSpaceInitialise(this,local_88,(this->common_consts_).sinio,(this->common_consts_).cosio,
                            local_60,local_48,local_20,(this->common_consts_).xmdot,
                            (this->common_consts_).omgdot,(this->common_consts_).xnodot);
      }
      else {
        dVar9 = (this->elements_).eccentricity_;
        dVar8 = 0.0;
        if (0.0001 < dVar9) {
          dVar8 = (local_40 * local_28 * 0.004690139440023056 * dVar2 * *sinio) / dVar9;
        }
        (this->nearspace_consts_).c5 =
             ((local_58 + local_50) * 2.75 + 1.0 + local_50 * local_58) *
             local_20 * (local_80 + local_80) * (this->elements_).recovered_semi_major_axis_;
        local_20 = dVar8 * (this->elements_).bstar_;
        dVar2 = cos((this->elements_).argument_perigee_);
        (this->nearspace_consts_).omgcof = dVar2 * local_20;
        (this->nearspace_consts_).xmcof = 0.0;
        if (0.0001 < (this->elements_).eccentricity_) {
          (this->nearspace_consts_).xmcof =
               (local_28 * -0.6666666666666666 * (this->elements_).bstar_) / local_50;
        }
        local_20 = (this->common_consts_).eta;
        dVar2 = cos((this->elements_).mean_anomoly_);
        dVar2 = pow(dVar2 * local_20 + 1.0,3.0);
        (this->nearspace_consts_).delmo = dVar2;
        dVar2 = sin((this->elements_).mean_anomoly_);
        (this->nearspace_consts_).sinmo = dVar2;
        if (this->use_simple_model_ == false) {
          dVar2 = (this->common_consts_).c1;
          dVar8 = dVar2 * dVar2;
          dVar9 = (this->elements_).recovered_semi_major_axis_;
          dVar10 = dVar9 * 4.0 * local_40 * dVar8;
          (this->nearspace_consts_).d2 = dVar10;
          dVar7 = (local_40 * dVar10 * dVar2) / 3.0;
          dVar6 = (dVar9 * 17.0 + (double)local_38._0_8_) * dVar7;
          (this->nearspace_consts_).d3 = dVar6;
          dVar9 = (dVar9 * 221.0 + (double)local_38._0_8_ * 31.0) * dVar7 * 0.5 * dVar9 * local_40 *
                  dVar2;
          (this->nearspace_consts_).d4 = dVar9;
          (this->nearspace_consts_).t3cof = dVar8 + dVar8 + dVar10;
          (this->nearspace_consts_).t4cof =
               (dVar6 * 3.0 + (dVar10 * 12.0 + dVar8 * 10.0) * dVar2) * 0.25;
          (this->nearspace_consts_).t5cof =
               ((dVar10 + dVar10 + dVar8) * dVar8 * 15.0 +
               dVar10 * 6.0 * dVar10 + dVar9 * 3.0 + dVar2 * 12.0 * dVar6) * 0.2;
        }
      }
      return;
    }
    this_00 = (SatelliteException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException(this_00,"Inclination out of range");
  }
  __cxa_throw(this_00,&SatelliteException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SGP4::Initialise()
{
    /*
     * reset all constants etc
     */
    Reset();

    /*
     * error checks
     */
    if (elements_.Eccentricity() < 0.0 || elements_.Eccentricity() > 0.999)
    {
        throw SatelliteException("Eccentricity out of range");
    }

    if (elements_.Inclination() < 0.0 || elements_.Inclination() > kPI)
    {
        throw SatelliteException("Inclination out of range");
    }

    RecomputeConstants(elements_.Inclination(),
                       common_consts_.sinio,
                       common_consts_.cosio,
                       common_consts_.x3thm1,
                       common_consts_.x1mth2,
                       common_consts_.x7thm1,
                       common_consts_.xlcof,
                       common_consts_.aycof);

    const double theta2 = common_consts_.cosio * common_consts_.cosio;
    const double eosq = elements_.Eccentricity() * elements_.Eccentricity();
    const double betao2 = 1.0 - eosq;
    const double betao = sqrt(betao2);

    if (elements_.Period() >= 225.0)
    {
        use_deep_space_ = true;
    }
    else
    {
        use_deep_space_ = false;
        use_simple_model_ = false;
        /*
         * for perigee less than 220 kilometers, the simple_model flag is set
         * and the equations are truncated to linear variation in sqrt a and
         * quadratic variation in mean anomly. also, the c3 term, the
         * delta omega term and the delta m term are dropped
         */
        if (elements_.Perigee() < 220.0)
        {
            use_simple_model_ = true;
        }
    }

    /*
     * for perigee below 156km, the values of
     * s4 and qoms2t are altered
     */
    double s4 = kS;
    double qoms24 = kQOMS2T;
    if (elements_.Perigee() < 156.0)
    {
        s4 = elements_.Perigee() - 78.0;
        if (elements_.Perigee() < 98.0) 
        {
            s4 = 20.0;
        }
        qoms24 = pow((120.0 - s4) * kAE / kXKMPER, 4.0);
        s4 = s4 / kXKMPER + kAE;
    }

    /*
     * generate constants
     */
    const double pinvsq = 1.0
        / (elements_.RecoveredSemiMajorAxis()
                * elements_.RecoveredSemiMajorAxis()
                * betao2 * betao2);
    const double tsi = 1.0 / (elements_.RecoveredSemiMajorAxis() - s4);
    common_consts_.eta = elements_.RecoveredSemiMajorAxis()
        * elements_.Eccentricity() * tsi;
    const double etasq = common_consts_.eta * common_consts_.eta;
    const double eeta = elements_.Eccentricity() * common_consts_.eta;
    const double psisq = fabs(1.0 - etasq);
    const double coef = qoms24 * pow(tsi, 4.0);
    const double coef1 = coef / pow(psisq, 3.5);
    const double c2 = coef1 * elements_.RecoveredMeanMotion()
        * (elements_.RecoveredSemiMajorAxis()
        * (1.0 + 1.5 * etasq + eeta * (4.0 + etasq))
        + 0.75 * kCK2 * tsi / psisq * common_consts_.x3thm1
        * (8.0 + 3.0 * etasq * (8.0 + etasq)));
    common_consts_.c1 = elements_.BStar() * c2;
    common_consts_.c4 = 2.0 * elements_.RecoveredMeanMotion()
        * coef1 * elements_.RecoveredSemiMajorAxis() * betao2
        * (common_consts_.eta * (2.0 + 0.5 * etasq) + elements_.Eccentricity()
        * (0.5 + 2.0 * etasq)
        - 2.0 * kCK2 * tsi / (elements_.RecoveredSemiMajorAxis() * psisq)
        * (-3.0 * common_consts_.x3thm1 * (1.0 - 2.0 * eeta + etasq
        * (1.5 - 0.5 * eeta))
        + 0.75 * common_consts_.x1mth2 * (2.0 * etasq - eeta *
            (1.0 + etasq)) * cos(2.0 * elements_.ArgumentPerigee())));
    const double theta4 = theta2 * theta2;
    const double temp1 = 3.0 * kCK2 * pinvsq * elements_.RecoveredMeanMotion();
    const double temp2 = temp1 * kCK2 * pinvsq;
    const double temp3 = 1.25 * kCK4 * pinvsq * pinvsq * elements_.RecoveredMeanMotion();
    common_consts_.xmdot = elements_.RecoveredMeanMotion() + 0.5 * temp1 * betao *
            common_consts_.x3thm1 + 0.0625 * temp2 * betao *
            (13.0 - 78.0 * theta2 + 137.0 * theta4);
    const double x1m5th = 1.0 - 5.0 * theta2;
    common_consts_.omgdot = -0.5 * temp1 * x1m5th +
            0.0625 * temp2 * (7.0 - 114.0 * theta2 + 395.0 * theta4) +
            temp3 * (3.0 - 36.0 * theta2 + 49.0 * theta4);
    const double xhdot1 = -temp1 * common_consts_.cosio;
    common_consts_.xnodot = xhdot1 + (0.5 * temp2 * (4.0 - 19.0 * theta2) + 2.0 * temp3 *
            (3.0 - 7.0 * theta2)) * common_consts_.cosio;
    common_consts_.xnodcf = 3.5 * betao2 * xhdot1 * common_consts_.c1;
    common_consts_.t2cof = 1.5 * common_consts_.c1;

    if (use_deep_space_)
    {
        deepspace_consts_.gsto = elements_.Epoch().ToGreenwichSiderealTime();

        DeepSpaceInitialise(eosq,
                            common_consts_.sinio,
                            common_consts_.cosio,
                            betao,
                            theta2,
                            betao2,
                            common_consts_.xmdot,
                            common_consts_.omgdot,
                            common_consts_.xnodot);
    }
    else
    {
        double c3 = 0.0;
        if (elements_.Eccentricity() > 1.0e-4)
        {
            c3 = coef * tsi * kA3OVK2 * elements_.RecoveredMeanMotion() * kAE *
                    common_consts_.sinio / elements_.Eccentricity();
        }

        nearspace_consts_.c5 = 2.0 * coef1 * elements_.RecoveredSemiMajorAxis() * betao2 * (1.0 + 2.75 *
                (etasq + eeta) + eeta * etasq);
        nearspace_consts_.omgcof = elements_.BStar() * c3 * cos(elements_.ArgumentPerigee());

        nearspace_consts_.xmcof = 0.0;
        if (elements_.Eccentricity() > 1.0e-4)
        {
            nearspace_consts_.xmcof = -kTWOTHIRD * coef * elements_.BStar() * kAE / eeta;
        }

        nearspace_consts_.delmo = pow(1.0 + common_consts_.eta * (cos(elements_.MeanAnomoly())), 3.0);
        nearspace_consts_.sinmo = sin(elements_.MeanAnomoly());

        if (!use_simple_model_)
        {
            const double c1sq = common_consts_.c1 * common_consts_.c1;
            nearspace_consts_.d2 = 4.0 * elements_.RecoveredSemiMajorAxis() * tsi * c1sq;
            const double temp = nearspace_consts_.d2 * tsi * common_consts_.c1 / 3.0;
            nearspace_consts_.d3 = (17.0 * elements_.RecoveredSemiMajorAxis() + s4) * temp;
            nearspace_consts_.d4 = 0.5 * temp * elements_.RecoveredSemiMajorAxis() *
                    tsi * (221.0 * elements_.RecoveredSemiMajorAxis() + 31.0 * s4) * common_consts_.c1;
            nearspace_consts_.t3cof = nearspace_consts_.d2 + 2.0 * c1sq;
            nearspace_consts_.t4cof = 0.25 * (3.0 * nearspace_consts_.d3 + common_consts_.c1 *
                    (12.0 * nearspace_consts_.d2 + 10.0 * c1sq));
            nearspace_consts_.t5cof = 0.2 * (3.0 * nearspace_consts_.d4 + 12.0 * common_consts_.c1 *
                    nearspace_consts_.d3 + 6.0 * nearspace_consts_.d2 * nearspace_consts_.d2 + 15.0 *
                    c1sq * (2.0 * nearspace_consts_.d2 + c1sq));
        }
    }
}